

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDriver.cpp
# Opt level: O0

void SimulateShadowAgainstBarbarian(void)

{
  bool bVar1;
  Character *char1;
  Character *char2;
  ostream *poVar2;
  Barbarian *barb;
  Shadow *shadow;
  bool passed;
  
  char1 = (Character *)operator_new(0x60);
  Shadow::Shadow((Shadow *)char1);
  char2 = (Character *)operator_new(0x60);
  Barbarian::Barbarian((Barbarian *)char2);
  bVar1 = sim(char1,char2,1000000,1.0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Passed!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"failed!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if (char1 != (Character *)0x0) {
    Shadow::~Shadow((Shadow *)char1);
    operator_delete(char1);
  }
  if (char2 != (Character *)0x0) {
    Barbarian::~Barbarian((Barbarian *)char2);
    operator_delete(char2);
  }
  return;
}

Assistant:

void SimulateShadowAgainstBarbarian()
{
    bool passed;

    Shadow *shadow = new Shadow();
    Barbarian *barb = new Barbarian();
    passed = sim(shadow, barb, NUM_TEST_RUNS, 1.0);
    if(passed)
    {
        std::cout << "Passed!" << std::endl;
    }
    else
    {
        std::cout << "failed!" << std::endl;
    }
    delete shadow;
    delete barb;
}